

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aacStreamReader.cpp
# Opt level: O2

string * __thiscall
AACStreamReader::getStreamInfo_abi_cxx11_(string *__return_storage_ptr__,AACStreamReader *this)

{
  ostream *poVar1;
  ostringstream str;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"Sample Rate: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_AACCodec).m_sample_rate / 1000);
  std::operator<<(poVar1,"KHz  ");
  poVar1 = std::operator<<((ostream *)local_190,"Channels: ");
  std::ostream::operator<<(poVar1,(uint)(this->super_AACCodec).m_channels);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

const std::string AACStreamReader::getStreamInfo()
{
    std::ostringstream str;
    str << "Sample Rate: " << m_sample_rate / 1000 << "KHz  ";
    str << "Channels: " << static_cast<int>(m_channels);
    return str.str();
}